

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int handle_script(lua_State *L,char **argv)

{
  int iVar1;
  char *pcStack_28;
  int n;
  char *fname;
  int status;
  char **argv_local;
  lua_State *L_local;
  
  pcStack_28 = *argv;
  iVar1 = strcmp(pcStack_28,"-");
  if (iVar1 == 0) {
    iVar1 = strcmp(argv[-1],"--");
    if (iVar1 != 0) {
      pcStack_28 = (char *)0x0;
    }
  }
  fname._4_4_ = luaL_loadfilex(L,pcStack_28,(char *)0x0);
  if (fname._4_4_ == 0) {
    iVar1 = pushargs(L);
    fname._4_4_ = docall(L,iVar1,-1);
  }
  iVar1 = report(L,fname._4_4_);
  return iVar1;
}

Assistant:

static int handle_script (lua_State *L, char **argv) {
  int status;
  const char *fname = argv[0];
  if (strcmp(fname, "-") == 0 && strcmp(argv[-1], "--") != 0)
    fname = NULL;  /* stdin */
  status = luaL_loadfile(L, fname);
  if (status == LUA_OK) {
    int n = pushargs(L);  /* push arguments to script */
    status = docall(L, n, LUA_MULTRET);
  }
  return report(L, status);
}